

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsCouple.h
# Opt level: O2

void __thiscall chrono::ChShaftsCouple::ArchiveOUT(ChShaftsCouple *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) override {
        // version number
        marchive.VersionWrite<ChShaftsCouple>();

        // serialize parent class
        ChPhysicsItem::ArchiveOUT(marchive);

        // serialize all member data:
        // marchive << CHNVP(shaft1);  //***TODO*** serialize, with shared ptr
        // marchive << CHNVP(shaft2);  //***TODO*** serialize, with shared ptr
    }